

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

void __thiscall cmFileCopier::DefaultDirectoryPermissions(cmFileCopier *this)

{
  cmFileCopier *this_local;
  
  this->DirPermissions = 0;
  this->DirPermissions = this->DirPermissions | 0x100;
  this->DirPermissions = this->DirPermissions | 0x80;
  this->DirPermissions = this->DirPermissions | 0x40;
  this->DirPermissions = this->DirPermissions | 0x20;
  this->DirPermissions = this->DirPermissions | 8;
  this->DirPermissions = this->DirPermissions | 4;
  this->DirPermissions = this->DirPermissions | 1;
  return;
}

Assistant:

void cmFileCopier::DefaultDirectoryPermissions()
{
  // Use read/write/executable permissions.
  this->DirPermissions = 0;
  this->DirPermissions |= mode_owner_read;
  this->DirPermissions |= mode_owner_write;
  this->DirPermissions |= mode_owner_execute;
  this->DirPermissions |= mode_group_read;
  this->DirPermissions |= mode_group_execute;
  this->DirPermissions |= mode_world_read;
  this->DirPermissions |= mode_world_execute;
}